

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::tls1_get_legacy_signature_algorithm(uint16_t *out,EVP_PKEY *pkey)

{
  uint16_t uVar1;
  int iVar2;
  
  iVar2 = EVP_PKEY_id((EVP_PKEY *)pkey);
  if (iVar2 == 6) {
    uVar1 = 0xff01;
  }
  else {
    if (iVar2 != 0x198) {
      return false;
    }
    uVar1 = 0x203;
  }
  *out = uVar1;
  return true;
}

Assistant:

bool tls1_get_legacy_signature_algorithm(uint16_t *out, const EVP_PKEY *pkey) {
  switch (EVP_PKEY_id(pkey)) {
    case EVP_PKEY_RSA:
      *out = SSL_SIGN_RSA_PKCS1_MD5_SHA1;
      return true;
    case EVP_PKEY_EC:
      *out = SSL_SIGN_ECDSA_SHA1;
      return true;
    default:
      return false;
  }
}